

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_crt.c
# Opt level: O0

int mbedtls_x509_crt_verify_info(char *buf,size_t size,char *prefix,uint32_t flags)

{
  int iVar1;
  ulong local_48;
  size_t n;
  char *p;
  x509_crt_verify_string *cur;
  int ret;
  uint32_t flags_local;
  char *prefix_local;
  size_t size_local;
  char *buf_local;
  
  local_48 = size;
  n = (size_t)buf;
  cur._4_4_ = flags;
  for (p = "\x01"; *(long *)(p + 8) != 0; p = p + 0x10) {
    if ((cur._4_4_ & *(uint *)p) != 0) {
      iVar1 = snprintf((char *)n,local_48,"%s%s\n",prefix,*(undefined8 *)(p + 8));
      if ((iVar1 < 0) || (local_48 <= (ulong)(long)iVar1)) {
        return -0x2980;
      }
      local_48 = local_48 - (long)iVar1;
      n = (long)iVar1 + n;
      cur._4_4_ = *(uint *)p ^ cur._4_4_;
    }
  }
  if (cur._4_4_ != 0) {
    iVar1 = snprintf((char *)n,local_48,"%sUnknown reason (this should not happen)\n",prefix);
    if ((iVar1 < 0) || (local_48 <= (ulong)(long)iVar1)) {
      return -0x2980;
    }
    local_48 = local_48 - (long)iVar1;
  }
  return (int)size - (int)local_48;
}

Assistant:

int mbedtls_x509_crt_verify_info( char *buf, size_t size, const char *prefix,
                          uint32_t flags )
{
    int ret;
    const struct x509_crt_verify_string *cur;
    char *p = buf;
    size_t n = size;

    for( cur = x509_crt_verify_strings; cur->string != NULL ; cur++ )
    {
        if( ( flags & cur->code ) == 0 )
            continue;

        ret = mbedtls_snprintf( p, n, "%s%s\n", prefix, cur->string );
        MBEDTLS_X509_SAFE_SNPRINTF;
        flags ^= cur->code;
    }

    if( flags != 0 )
    {
        ret = mbedtls_snprintf( p, n, "%sUnknown reason "
                                       "(this should not happen)\n", prefix );
        MBEDTLS_X509_SAFE_SNPRINTF;
    }

    return( (int) ( size - n ) );
}